

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

Segment * reflection(Segment *__return_storage_ptr__,Segment *segment,Plane *plane)

{
  Point *pPVar1;
  float fVar2;
  Point PVar3;
  Point PVar4;
  undefined8 local_c8;
  float local_c0;
  Point local_98 [4];
  Point local_68;
  Point local_58;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  undefined1 local_28 [8];
  Vector ri;
  Plane *plane_local;
  Segment *segment_local;
  
  local_40 = (segment->b).z;
  pPVar1 = &segment->b;
  local_48._0_4_ = pPVar1->x;
  local_48._4_4_ = pPVar1->y;
  local_38 = local_48;
  local_30 = local_40;
  unique0x10000239 = plane;
  PVar3 = operator-(*pPVar1,&segment->a);
  local_58.z = PVar3.z;
  ri.x = local_58.z;
  local_58._0_8_ = PVar3._0_8_;
  local_28._0_4_ = local_58.x;
  local_28._4_4_ = local_58.y;
  PVar4.x = (stack0xffffffffffffffe8->normal).x;
  PVar4.y = (stack0xffffffffffffffe8->normal).y;
  PVar4.z = (stack0xffffffffffffffe8->normal).z;
  local_58 = PVar3;
  fVar2 = dotProduct((Vector *)local_28,&stack0xffffffffffffffe8->normal);
  PVar4 = operator*(PVar4,fVar2 + fVar2);
  local_98[0].z = PVar4.z;
  local_68.z = local_98[0].z;
  local_98[0]._0_8_ = PVar4._0_8_;
  local_68.x = local_98[0].x;
  local_68.y = local_98[0].y;
  operator-=((Vector *)local_28,&local_68);
  (__return_storage_ptr__->a).z = (segment->b).z;
  fVar2 = (segment->b).y;
  (__return_storage_ptr__->a).x = (segment->b).x;
  (__return_storage_ptr__->a).y = fVar2;
  PVar4 = operator+(segment->b,(Vector *)local_28);
  local_c8 = PVar4._0_8_;
  (__return_storage_ptr__->b).x = (float)(undefined4)local_c8;
  (__return_storage_ptr__->b).y = (float)local_c8._4_4_;
  local_c0 = PVar4.z;
  (__return_storage_ptr__->b).z = local_c0;
  return __return_storage_ptr__;
}

Assistant:

Segment reflection(Segment const& segment, Plane const& plane)
{
  Vector ri = segment.b - segment.a;
  ri -= plane.normal * (2 * dotProduct(ri, plane.normal));
  return {segment.b, segment.b + ri};
}